

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGridPlane
          (Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  BBox1f time_range;
  ulong uVar7;
  _func_int **pp_Var8;
  reference pvVar9;
  unsigned_long *puVar10;
  Vec3fa *pVVar11;
  long lVar12;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Node *in_RDI;
  ulong in_R8;
  ulong in_R9;
  float fVar13;
  long *in_stack_00000008;
  size_t i_4;
  Vec3fa p;
  size_t x;
  size_t y;
  Ref<embree::SceneGraph::GridMeshNode> mesh;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffffa78;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *in_stack_fffffffffffffa80;
  size_t in_stack_fffffffffffffa88;
  float local_510;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  GridMeshNode *in_stack_fffffffffffffb08;
  float in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb14;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined1 local_438 [4];
  float fStack_434;
  float fStack_430;
  ulong local_420;
  ulong local_418;
  Grid local_40c;
  undefined1 local_3fd;
  undefined4 local_3fc;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 uStack_3f0;
  long *local_3e0;
  _func_int **local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  undefined8 *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  long **local_398;
  undefined4 *local_390;
  undefined4 *local_388;
  undefined4 *local_380;
  long **local_378;
  ulong local_368;
  reference local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined1 *local_348;
  undefined8 *local_340;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  float local_304;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e8;
  float local_2dc;
  undefined8 *local_2d8;
  long local_2d0;
  reference local_2c8;
  long local_2c0;
  reference local_2b8;
  long local_2b0;
  reference local_2a8;
  _func_int **local_2a0;
  _func_int ***local_298;
  _func_int ***local_290;
  _func_int ***local_288;
  _func_int ***local_280;
  _func_int ***local_278;
  _func_int ***local_270;
  _func_int ***local_268;
  _func_int ***local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  float local_164;
  undefined8 *local_160;
  float local_154;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_3d0 = in_R9;
  local_3c8 = in_R8;
  local_3c0 = in_RCX;
  local_3b8 = in_RDX;
  local_3b0 = in_RSI;
  pp_Var8 = (_func_int **)::operator_new(0xa8);
  local_3fd = 1;
  local_398 = &local_3e0;
  local_3e0 = (long *)*in_stack_00000008;
  if (local_3e0 != (long *)0x0) {
    (**(code **)(*local_3e0 + 0x10))();
  }
  local_3f8 = 0;
  local_3fc = 0x3f800000;
  local_380 = &local_3f4;
  local_388 = &local_3f8;
  local_390 = &local_3fc;
  local_3f4 = 0;
  uStack_3f0 = 0x3f800000;
  time_range.upper = in_stack_fffffffffffffb14;
  time_range.lower = in_stack_fffffffffffffb10;
  GridMeshNode::GridMeshNode
            (in_stack_fffffffffffffb08,
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),time_range,
             CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  local_3fd = 0;
  local_298 = &local_3d8;
  local_2a0 = pp_Var8;
  local_3d8 = pp_Var8;
  if (pp_Var8 != (_func_int **)0x0) {
    (**(code **)(*pp_Var8 + 0x10))();
  }
  local_378 = &local_3e0;
  if (local_3e0 != (long *)0x0) {
    (**(code **)(*local_3e0 + 0x18))();
  }
  local_270 = &local_3d8;
  pvVar9 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_3d8 + 0xe),0);
  local_98 = (local_3c8 + 1) * (local_3d0 + 1);
  local_368 = local_98;
  local_360 = pvVar9;
  local_28 = local_98;
  local_20 = pvVar9;
  if (pvVar9->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar9->size_alloced != 0) {
      local_30 = pvVar9->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar10 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar10;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar9->size_alloced;
  }
  local_a0 = local_18;
  uVar7 = local_98;
  if (local_98 < pvVar9->size_active) {
    while (local_a8 = uVar7, local_a8 < pvVar9->size_active) {
      uVar7 = local_a8 + 1;
    }
    pvVar9->size_active = local_98;
  }
  local_90 = pvVar9;
  if (local_18 == pvVar9->size_alloced) {
    for (local_b0 = pvVar9->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar9->items + local_b0;
    }
    pvVar9->size_active = local_98;
  }
  else {
    local_b8 = pvVar9->items;
    local_50 = local_18;
    local_48 = pvVar9;
    pVVar11 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffffa88,(size_t)in_stack_fffffffffffffa80);
    pvVar9->items = pVVar11;
    for (local_c0 = 0; local_c0 < pvVar9->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar9->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar9->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar9->items + local_c8;
    }
    local_68 = pvVar9->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar9;
    alignedFree(in_stack_fffffffffffffa78);
    pvVar9->size_active = local_98;
    pvVar9->size_alloced = local_a0;
  }
  local_278 = &local_3d8;
  GridMeshNode::Grid::Grid(&local_40c,0,(int)local_3c8 + 1U,(int)local_3c8 + 1U,(int)local_3d0 + 1);
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::push_back(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  for (local_418 = 0; local_418 <= local_3d0; local_418 = local_418 + 1) {
    for (local_420 = 0; local_420 <= local_3c8; local_420 = local_420 + 1) {
      local_2dc = (float)local_420 / (float)local_3c8;
      local_2d8 = &local_458;
      local_2e8 = local_3b8;
      local_160 = &local_2f8;
      local_118 = CONCAT44(local_2dc,local_2dc);
      uStack_110 = CONCAT44(local_2dc,local_2dc);
      local_1c0 = &local_458;
      local_1c8 = &local_2f8;
      local_1d0 = local_3b8;
      uVar1 = *local_3b8;
      uVar2 = local_3b8[1];
      local_128._0_4_ = (float)uVar1;
      local_128._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_120._0_4_ = (float)uVar2;
      uStack_120._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_1b8 = local_2dc * (float)local_128;
      fStack_1b4 = local_2dc * local_128._4_4_;
      fStack_1b0 = local_2dc * (float)uStack_120;
      fStack_1ac = local_2dc * uStack_120._4_4_;
      local_1a8 = &local_458;
      local_248 = CONCAT44(fStack_1b4,local_1b8);
      uStack_240 = CONCAT44(fStack_1ac,fStack_1b0);
      local_330 = &local_448;
      local_340 = &local_458;
      uVar3 = *local_3b0;
      uVar4 = local_3b0[1];
      local_238._0_4_ = (float)uVar3;
      local_238._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_230._0_4_ = (float)uVar4;
      uStack_230._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_208 = (float)local_238 + local_1b8;
      fStack_204 = local_238._4_4_ + fStack_1b4;
      fStack_200 = (float)uStack_230 + fStack_1b0;
      fStack_1fc = uStack_230._4_4_ + fStack_1ac;
      local_1f0 = &local_448;
      local_218 = CONCAT44(fStack_204,local_208);
      uStack_210 = CONCAT44(fStack_1fc,fStack_200);
      local_510 = (float)local_3d0;
      local_304 = (float)local_418 / local_510;
      local_300 = &local_468;
      local_310 = local_3c0;
      local_150 = &local_328;
      local_138 = CONCAT44(local_304,local_304);
      uStack_130 = CONCAT44(local_304,local_304);
      local_190 = &local_468;
      local_198 = &local_328;
      local_1a0 = local_3c0;
      uVar5 = *local_3c0;
      uVar6 = local_3c0[1];
      local_148._0_4_ = (float)uVar5;
      local_148._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_140._0_4_ = (float)uVar6;
      uStack_140._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_188 = local_304 * (float)local_148;
      fStack_184 = local_304 * local_148._4_4_;
      fStack_180 = local_304 * (float)uStack_140;
      fStack_17c = local_304 * uStack_140._4_4_;
      local_170 = &local_468;
      local_228 = CONCAT44(fStack_184,local_188);
      uStack_220 = CONCAT44(fStack_17c,fStack_180);
      local_348 = local_438;
      local_350 = &local_448;
      local_358 = &local_468;
      fVar13 = local_208 + local_188;
      fStack_434 = fStack_204 + fStack_184;
      fStack_430 = fStack_200 + fStack_180;
      fStack_1dc = fStack_1fc + fStack_17c;
      local_1d8 = local_438;
      lVar12 = local_418 * (local_3c8 + 1) + local_420;
      local_280 = &local_3d8;
      local_238 = uVar3;
      uStack_230 = uVar4;
      local_1e8 = fVar13;
      fStack_1e4 = fStack_434;
      fStack_1e0 = fStack_430;
      local_164 = local_2dc;
      local_154 = local_304;
      local_148 = uVar5;
      uStack_140 = uVar6;
      local_128 = uVar1;
      uStack_120 = uVar2;
      local_108 = local_304;
      fStack_104 = local_304;
      fStack_100 = local_304;
      fStack_fc = local_304;
      local_f8 = local_304;
      local_e8 = local_2dc;
      fStack_e4 = local_2dc;
      fStack_e0 = local_2dc;
      fStack_dc = local_2dc;
      local_d8 = local_2dc;
      local_468 = local_228;
      uStack_460 = uStack_220;
      local_458 = local_248;
      uStack_450 = uStack_240;
      local_448 = local_218;
      uStack_440 = uStack_210;
      local_328 = local_138;
      uStack_320 = uStack_130;
      local_2f8 = local_118;
      uStack_2f0 = uStack_110;
      local_2a8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3d8 + 0xe),0);
      local_2a8->items[lVar12].field_0.m128[0] = fVar13;
      local_288 = &local_3d8;
      local_2b0 = lVar12;
      local_2b8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3d8 + 0xe),0);
      local_2b8->items[lVar12].field_0.m128[1] = fStack_434;
      local_290 = &local_3d8;
      local_2c0 = lVar12;
      local_2c8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3d8 + 0xe),0);
      local_2c8->items[lVar12].field_0.m128[2] = fStack_430;
      local_2d0 = lVar12;
    }
  }
  local_268 = &local_3d8;
  local_10 = local_3d8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_3d8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_258 = &local_3d8;
  if (local_3d8 != (_func_int **)0x0) {
    (**(code **)(*local_3d8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(0,(unsigned)width+1,(unsigned)width+1,(unsigned)height+1));

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }